

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment.cpp
# Opt level: O0

dispatcher_ptr __thiscall
anon_unknown.dwarf_1a3bd2::make_dispatcher_for_kind<(pstore::repo::section_kind)9>
          (anon_unknown_dwarf_1a3bd2 *this,fragment *f,
          not_null<std::aligned_storage<16UL,_8UL>::type_*> buffer)

{
  type *this_00;
  type *s;
  nop_deleter local_21;
  fragment *local_20;
  fragment *f_local;
  not_null<std::aligned_storage<16UL,_8UL>::type_*> buffer_local;
  
  local_20 = f;
  f_local = (fragment *)buffer.ptr_;
  buffer_local.ptr_ = (type *)this;
  this_00 = pstore::gsl::not_null::operator_cast_to_type_((not_null *)&f_local);
  s = pstore::repo::fragment::at<(pstore::repo::section_kind)9>(local_20);
  pstore::repo::section_dispatcher::section_dispatcher((section_dispatcher *)&this_00->__align,s);
  std::unique_ptr<pstore::repo::dispatcher,(anonymous_namespace)::nop_deleter>::
  unique_ptr<(anonymous_namespace)::nop_deleter,void>
            ((unique_ptr<pstore::repo::dispatcher,(anonymous_namespace)::nop_deleter> *)this,
             (pointer)&this_00->__align,&local_21);
  return (__uniq_ptr_data<pstore::repo::dispatcher,_(anonymous_namespace)::nop_deleter,_true,_true>)
         (__uniq_ptr_data<pstore::repo::dispatcher,_(anonymous_namespace)::nop_deleter,_true,_true>)
         this;
}

Assistant:

dispatcher_ptr
    make_dispatcher_for_kind (fragment const & f,
                              pstore::gsl::not_null<dispatcher_buffer *> const buffer) {
        using dispatcher_type =
            typename section_to_dispatcher<typename enum_to_section<Kind>::type>::type;
        static_assert (sizeof (dispatcher_type) <= sizeof (dispatcher_buffer),
                       "dispatcher buffer is too small");
        static_assert (alignof (dispatcher_type) <= alignof (dispatcher_buffer),
                       "dispatcher buffer is insufficiently aligned");
        return dispatcher_ptr (new (buffer) dispatcher_type (f.at<Kind> ()), nop_deleter{});
    }